

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBuiltinPrecisionTests.cpp
# Opt level: O1

TestCaseGroup * deqp::gles3::Functional::createBuiltinPrecisionTests(Context *context)

{
  TestCaseGroup *this;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> shaderTypes;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  es3Cases;
  ShaderType local_3c;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> local_38;
  CaseFactories *local_20;
  
  this = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"precision","Builtin precision tests");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_0217f168;
  this->m_context = context;
  local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_finish = (ShaderType *)0x0;
  local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (ShaderType *)0x0;
  deqp::gls::BuiltinPrecisionTests::createES3BuiltinCases();
  local_3c = SHADERTYPE_VERTEX;
  if (local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::
    _M_realloc_insert<glu::ShaderType>
              (&local_38,
               (iterator)
               local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_3c);
  }
  else {
    *local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
     super__Vector_impl_data._M_finish = SHADERTYPE_VERTEX;
    local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_3c = SHADERTYPE_FRAGMENT;
  if (local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::
    _M_realloc_insert<glu::ShaderType>
              (&local_38,
               (iterator)
               local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_3c);
  }
  else {
    *local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
     super__Vector_impl_data._M_finish = SHADERTYPE_FRAGMENT;
    local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  deqp::gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
            (context->m_testCtx,context->m_renderCtx,local_20,&local_38,(TestCaseGroup *)this);
  if (local_20 != (CaseFactories *)0x0) {
    (*local_20->_vptr_CaseFactories[1])();
    local_20 = (CaseFactories *)0x0;
  }
  if (local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

TestCaseGroup* createBuiltinPrecisionTests (Context& context)
{
	TestCaseGroup*							group		= new TestCaseGroup(
		context, "precision", "Builtin precision tests");
	std::vector<glu::ShaderType>			shaderTypes;
	de::MovePtr<const bpt::CaseFactories>	es3Cases	= bpt::createES3BuiltinCases();

	shaderTypes.push_back(glu::SHADERTYPE_VERTEX);
	shaderTypes.push_back(glu::SHADERTYPE_FRAGMENT);

	bpt::addBuiltinPrecisionTests(context.getTestContext(),
								  context.getRenderContext(),
								  *es3Cases,
								  shaderTypes,
								  *group);
	return group;
}